

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateAutoRefFunctionSet(ExpressionContext *ctx,SynBase *source,ExprBase *value,InplaceStr name)

{
  IntrusiveList<FunctionHandle> functions_00;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  FunctionData **ppFVar4;
  FunctionHandle *this;
  ArrayView<TypeBase_*> setTypes;
  ArrayView<TypeBase*> local_148 [16];
  TypeFunctionSet *local_138;
  TypeFunctionSet *type;
  TypeBase *local_128;
  FunctionHandle *local_120;
  FunctionHandle *curr;
  FunctionHandle *prev;
  TypeGenericClassProto *proto;
  TypeBase *pTStack_100;
  uint hash;
  TypeBase *parentType;
  FunctionData *function;
  uint i;
  undefined1 auStack_e0 [8];
  IntrusiveList<FunctionHandle> functions;
  SmallArray<TypeBase_*,_16U> types;
  ExprBase *value_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  InplaceStr name_local;
  
  SmallArray<TypeBase_*,_16U>::SmallArray
            ((SmallArray<TypeBase_*,_16U> *)&functions.tail,ctx->allocator);
  IntrusiveList<FunctionHandle>::IntrusiveList((IntrusiveList<FunctionHandle> *)auStack_e0);
  for (function._0_4_ = 0; uVar1 = (uint)function,
      uVar3 = SmallArray<FunctionData_*,_128U>::size(&ctx->functions), uVar1 < uVar3;
      function._0_4_ = (uint)function + 1) {
    ppFVar4 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->functions,(uint)function);
    parentType = (TypeBase *)*ppFVar4;
    pTStack_100 = ((FunctionData *)parentType)->scope->ownerType;
    if (pTStack_100 != (TypeBase *)0x0) {
      proto._4_4_ = NULLC::StringHashContinue(pTStack_100->nameHash,"::");
      proto._4_4_ = NULLC::StringHashContinue(proto._4_4_,name.begin,name.end);
      if (((*(uint *)&parentType->refType == proto._4_4_) &&
          (bVar2 = IntrusiveList<MatchData>::empty
                             ((IntrusiveList<MatchData> *)&parentType->arrayTypes), bVar2)) &&
         (((*(byte *)(*(long *)((parentType->name).end + 0x20) + 0x3c) & 1) == 0 ||
          ((prev = (FunctionHandle *)
                   getType<TypeGenericClassProto>(*(TypeBase **)((parentType->name).end + 0x20)),
           (TypeGenericClassProto *)prev == (TypeGenericClassProto *)0x0 ||
           (bVar2 = IntrusiveList<ExprBase>::empty(&((TypeGenericClassProto *)prev)->instances),
           !bVar2)))))) {
        curr = (FunctionHandle *)0x0;
        if ((*(byte *)(*(long *)&parentType->typeIndex + 0x3c) & 1) == 0) {
          for (local_120 = (FunctionHandle *)auStack_e0; local_120 != (FunctionHandle *)0x0;
              local_120 = local_120->next) {
            if (local_120->function->type == *(TypeFunction **)&parentType->typeIndex) {
              curr = local_120;
              break;
            }
          }
        }
        if (curr == (FunctionHandle *)0x0) {
          local_128 = *(TypeBase **)&parentType->typeIndex;
          SmallArray<TypeBase_*,_16U>::push_back
                    ((SmallArray<TypeBase_*,_16U> *)&functions.tail,&local_128);
          this = ExpressionContext::get<FunctionHandle>(ctx);
          FunctionHandle::FunctionHandle(this,(FunctionData *)parentType);
          IntrusiveList<FunctionHandle>::push_back((IntrusiveList<FunctionHandle> *)auStack_e0,this)
          ;
        }
      }
    }
  }
  bVar2 = IntrusiveList<FunctionHandle>::empty((IntrusiveList<FunctionHandle> *)auStack_e0);
  if (bVar2) {
    if ((TypeStruct *)value->type != ctx->typeAutoRef) {
      name_local.end = (char *)0x0;
      goto LAB_001c22e7;
    }
    name_local.begin._0_4_ = (int)name.end;
    anon_unknown.dwarf_8df1c::Stop
              (ctx,source,"ERROR: function \'%.*s\' is undefined in any of existing classes",
               (ulong)(uint)((int)name_local.begin - (int)name.begin));
  }
  ArrayView<TypeBase*>::ArrayView<16u>(local_148,(SmallArray<TypeBase_*,_16U> *)&functions.tail);
  setTypes._12_4_ = 0;
  setTypes._0_12_ = local_148._0_12_;
  local_138 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
  name_local.end = (char *)ExpressionContext::get<ExprFunctionOverloadSet>(ctx);
  functions_00.tail = functions.head;
  functions_00.head = (FunctionHandle *)auStack_e0;
  ExprFunctionOverloadSet::ExprFunctionOverloadSet
            ((ExprFunctionOverloadSet *)name_local.end,source,&local_138->super_TypeBase,
             functions_00,value);
LAB_001c22e7:
  type._4_4_ = 1;
  SmallArray<TypeBase_*,_16U>::~SmallArray((SmallArray<TypeBase_*,_16U> *)&functions.tail);
  return (ExprBase *)name_local.end;
}

Assistant:

ExprBase* CreateAutoRefFunctionSet(ExpressionContext &ctx, SynBase *source, ExprBase *value, InplaceStr name)
{
	SmallArray<TypeBase*, 16> types(ctx.allocator);
	IntrusiveList<FunctionHandle> functions;

	// Find all member functions with the specified name
	for(unsigned i = 0; i < ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.functions[i];

		TypeBase *parentType = function->scope->ownerType;

		if(!parentType)
			continue;

		unsigned hash = NULLC::StringHashContinue(parentType->nameHash, "::");

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		if(function->nameHash != hash)
			continue;

		// Can't specify generic function arguments for call through 'auto ref'
		if(!function->generics.empty())
			continue;

		// Ignore generic types if they don't have a single instance
		if(function->scope->ownerType->isGeneric)
		{
			if(TypeGenericClassProto *proto = getType<TypeGenericClassProto>(function->scope->ownerType))
			{
				if(proto->instances.empty())
					continue;
			}
		}

		FunctionHandle *prev = NULL;

		// Pointer to generic types don't stricly match because they might be resolved to different types
		if (!function->type->isGeneric)
		{
			for(FunctionHandle *curr = functions.head; curr; curr = curr->next)
			{
				if(curr->function->type == function->type)
				{
					prev = curr;
					break;
				}
			}
		}

		if(prev)
			continue;

		types.push_back(function->type);
		functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(function));
	}

	if(functions.empty())
	{
		if(value->type != ctx.typeAutoRef)
			return NULL;

		Stop(ctx, source, "ERROR: function '%.*s' is undefined in any of existing classes", FMT_ISTR(name));
	}

	TypeFunctionSet *type = ctx.GetFunctionSetType(types);

	return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, functions, value);
}